

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFNumberTreeObjectHelper.cc
# Opt level: O2

bool __thiscall
QPDFNumberTreeObjectHelper::hasIndex(QPDFNumberTreeObjectHelper *this,numtree_number idx)

{
  bool bVar1;
  iterator i;
  iterator iStack_68;
  iterator local_38;
  
  find(&local_38,this,idx,false);
  end(&iStack_68,this);
  bVar1 = iterator::operator!=(&local_38,&iStack_68);
  iterator::~iterator(&iStack_68);
  iterator::~iterator(&local_38);
  return bVar1;
}

Assistant:

bool
QPDFNumberTreeObjectHelper::hasIndex(numtree_number idx)
{
    auto i = find(idx);
    return (i != this->end());
}